

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O2

bool CompareNodeBlockTime(NodeEvictionCandidate *a,NodeEvictionCandidate *b)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  
  lVar1 = (b->m_last_block_time).__r;
  lVar2 = (a->m_last_block_time).__r;
  if (lVar2 == lVar1) {
    cVar3 = b->fRelevantServices;
    if (a->fRelevantServices == (bool)cVar3) {
      cVar3 = (b->m_connected).__r < (a->m_connected).__r;
    }
  }
  else {
    cVar3 = lVar2 < lVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool CompareNodeBlockTime(const NodeEvictionCandidate &a, const NodeEvictionCandidate &b)
{
    // There is a fall-through here because it is common for a node to have many peers which have not yet relayed a block.
    if (a.m_last_block_time != b.m_last_block_time) return a.m_last_block_time < b.m_last_block_time;
    if (a.fRelevantServices != b.fRelevantServices) return b.fRelevantServices;
    return a.m_connected > b.m_connected;
}